

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_progressbar.cpp
# Opt level: O2

void QtMWidgets::ProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Orientation *pOVar1;
  undefined8 uVar2;
  bool bVar3;
  Orientation OVar4;
  QColor *pQVar5;
  Spec SVar6;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      valueChanged((ProgressBar *)_o,*_a[1]);
      return;
    case 1:
      reset((ProgressBar *)_o);
      return;
    case 2:
      setRange((ProgressBar *)_o,*_a[1],*_a[2]);
      return;
    case 3:
      SVar6 = *_a[1];
LAB_00168a80:
      setMinimum((ProgressBar *)_o,SVar6);
      return;
    case 4:
      SVar6 = *_a[1];
LAB_00168a4d:
      setMaximum((ProgressBar *)_o,SVar6);
      return;
    case 5:
      SVar6 = *_a[1];
LAB_00168ab1:
      setValue((ProgressBar *)_o,SVar6);
      return;
    case 6:
      OVar4 = *_a[1];
LAB_00168abd:
      setOrientation((ProgressBar *)_o,OVar4);
      return;
    case 7:
      _q_animation((ProgressBar *)_o,(QVariant *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    pOVar1 = (Orientation *)*_a;
    switch(_id) {
    case 0:
      OVar4 = minimum((ProgressBar *)_o);
      break;
    case 1:
      OVar4 = maximum((ProgressBar *)_o);
      break;
    case 2:
      OVar4 = value((ProgressBar *)_o);
      break;
    case 3:
      OVar4 = orientation((ProgressBar *)_o);
      break;
    case 4:
      bVar3 = invertedAppearance((ProgressBar *)_o);
      *(bool *)pOVar1 = bVar3;
      return;
    case 5:
      OVar4 = grooveHeight((ProgressBar *)_o);
      break;
    case 6:
      pQVar5 = highlightColor((ProgressBar *)_o);
      goto LAB_00168ad1;
    case 7:
      pQVar5 = grooveColor((ProgressBar *)_o);
LAB_00168ad1:
      uVar2 = *(undefined8 *)((long)&pQVar5->ct + 2);
      *(undefined8 *)pOVar1 = *(undefined8 *)pQVar5;
      *(undefined8 *)((long)pOVar1 + 6) = uVar2;
      return;
    }
    *pOVar1 = OVar4;
    break;
  case WriteProperty:
    if ((uint)_id < 8) {
      pQVar5 = (QColor *)*_a;
      switch(_id) {
      case 0:
        SVar6 = pQVar5->cspec;
        break;
      case 1:
        SVar6 = pQVar5->cspec;
        goto LAB_00168a4d;
      case 2:
        SVar6 = pQVar5->cspec;
        goto LAB_00168ab1;
      case 3:
        OVar4 = pQVar5->cspec;
        goto LAB_00168abd;
      case 4:
        setInvertedAppearance((ProgressBar *)_o,SUB41(pQVar5->cspec,0));
        return;
      case 5:
        setGrooveHeight((ProgressBar *)_o,pQVar5->cspec);
        return;
      case 6:
        setHighlightColor((ProgressBar *)_o,pQVar5);
        return;
      case 7:
        setGrooveColor((ProgressBar *)_o,pQVar5);
        return;
      }
      goto LAB_00168a80;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::ProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 7: _t->_q_animation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ProgressBar::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ProgressBar::valueChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->value(); break;
        case 3: *reinterpret_cast< Qt::Orientation*>(_v) = _t->orientation(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->invertedAppearance(); break;
        case 5: *reinterpret_cast< int*>(_v) = _t->grooveHeight(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        case 7: *reinterpret_cast< QColor*>(_v) = _t->grooveColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setValue(*reinterpret_cast< int*>(_v)); break;
        case 3: _t->setOrientation(*reinterpret_cast< Qt::Orientation*>(_v)); break;
        case 4: _t->setInvertedAppearance(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setGrooveHeight(*reinterpret_cast< int*>(_v)); break;
        case 6: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        case 7: _t->setGrooveColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}